

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O2

bool __thiscall
crnlib::texture_conversion::convert_stats::print
          (convert_stats *this,bool psnr_metrics,bool mip_stats,bool grayscale_sampling,
          char *pCSVStatsFile)

{
  uint uVar1;
  mipmapped_texture *pmVar2;
  mipmapped_texture *pmVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  image_u8 *other;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar7;
  image<crnlib::color_quad<unsigned_char,_int>_> *other_00;
  FILE *__s;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint face;
  uint uVar11;
  uint uVar12;
  uint level;
  uint level_00;
  uint uVar13;
  image_u8 grayscale_a;
  image_u8 grayscale_b;
  image_u8 b;
  dynamic_string filename;
  image_u8 a;
  error_metrics luma_error;
  error_metrics rgb_error;
  
  pmVar2 = this->m_pInput_tex;
  if (pmVar2 != (mipmapped_texture *)0x0) {
    uVar5 = pmVar2->m_width;
    uVar12 = pmVar2->m_height;
    uVar1 = (pmVar2->m_faces).m_size;
    uVar9 = 0;
    uVar11 = 0;
    if (uVar1 != 0) {
      uVar11 = ((pmVar2->m_faces).m_p)->m_size;
    }
    pcVar6 = pixel_format_helpers::get_pixel_format_string(pmVar2->m_format);
    console::info("Input texture: %ux%u, Levels: %u, Faces: %u, Format: %s",(ulong)uVar5,
                  (ulong)uVar12,(ulong)uVar11,(ulong)uVar1,pcVar6);
    console::info("Input pixels: %u, Input file size: %u, Input bits/pixel: %1.3f",
                  SUB84((double)(((float)this->m_input_file_size * 8.0) /
                                (float)this->m_total_input_pixels),0));
    uVar5 = (this->m_output_tex).m_width;
    uVar12 = (this->m_output_tex).m_height;
    uVar1 = (this->m_output_tex).m_faces.m_size;
    if (uVar1 != 0) {
      uVar9 = ((this->m_output_tex).m_faces.m_p)->m_size;
    }
    pixel_format_helpers::get_pixel_format_string((this->m_output_tex).m_format);
    console::info("Output texture: %ux%u, Levels: %u, Faces: %u, Format: %s",(ulong)uVar5,
                  (ulong)uVar12,(ulong)uVar9,(ulong)uVar1);
    console::info("Output pixels: %u, Output file size: %u, Output bits/pixel: %1.3f",
                  SUB84((double)(((float)this->m_output_file_size * 8.0) /
                                (float)this->m_total_output_pixels),0));
    if (this->m_output_comp_file_size != 0) {
      console::info("LZMA compressed output file size: %u bytes, %1.3f bits/pixel",
                    SUB84((double)(((float)this->m_output_comp_file_size * 8.0) /
                                  (float)this->m_total_output_pixels),0));
    }
    if (psnr_metrics) {
      pmVar3 = this->m_pInput_tex;
      if (((pmVar3->m_width == (this->m_output_tex).m_width) &&
          (pmVar3->m_height == (this->m_output_tex).m_height)) &&
         (uVar11 = (pmVar3->m_faces).m_size, uVar11 == (this->m_output_tex).m_faces.m_size)) {
        uVar5 = 0;
        uVar12 = 0;
        if (uVar11 != 0) {
          uVar5 = ((pmVar3->m_faces).m_p)->m_size;
          uVar12 = ((this->m_output_tex).m_faces.m_p)->m_size;
        }
        if (uVar5 < uVar12) {
          uVar12 = uVar5;
        }
        uVar5 = 1;
        if (mip_stats) {
          uVar5 = uVar12;
        }
        for (uVar12 = 0; uVar13 = 0xf, uVar12 != uVar11; uVar12 = uVar12 + 1) {
          uVar8 = 0;
          while (level_00 = (uint)uVar8, uVar5 != level_00) {
            a.m_width = 0;
            a.m_height = 0;
            a.m_pitch = 0;
            a.m_total = 0;
            a.m_pixel_buf.m_size = 0;
            a.m_pixel_buf.m_capacity = 0;
            a.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
            a.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
            b.m_width = 0;
            b.m_height = 0;
            b.m_pitch = 0;
            b.m_total = 0;
            b.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
            b.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
            b.m_pixel_buf.m_size = 0;
            b.m_pixel_buf.m_capacity = 0;
            b.m_comp_flags = uVar13;
            a.m_comp_flags = uVar13;
            other = mipmapped_texture::get_level_image(this->m_pInput_tex,uVar12,level_00,&a,3);
            piVar7 = mipmapped_texture::get_level_image(&this->m_output_tex,uVar12,level_00,&b,3);
            if (piVar7 != (image_u8 *)0x0 && other != (image_u8 *)0x0) {
              grayscale_a.m_width = 0;
              grayscale_a.m_height = 0;
              grayscale_a.m_pitch = 0;
              grayscale_a.m_total = 0;
              grayscale_a.m_pixel_buf.m_size = 0;
              grayscale_a.m_pixel_buf.m_capacity = 0;
              grayscale_a.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
              grayscale_a.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
              grayscale_b.m_width = 0;
              grayscale_b.m_height = 0;
              grayscale_b.m_pitch = 0;
              grayscale_b.m_total = 0;
              grayscale_b.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
              grayscale_b.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
              grayscale_b.m_pixel_buf.m_size = 0;
              grayscale_b.m_pixel_buf.m_capacity = 0;
              grayscale_a.m_comp_flags = uVar13;
              grayscale_b.m_comp_flags = uVar13;
              if (grayscale_sampling) {
                image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&grayscale_a,other);
                image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale(&grayscale_a);
                image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&grayscale_b,piVar7);
                piVar7 = &grayscale_b;
                image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale(piVar7);
                other = &grayscale_a;
              }
              console::info("Face %u Mipmap level %u statistics:",(ulong)uVar12,uVar8);
              image_utils::print_image_metrics(other,piVar7);
              if (((other->m_comp_flags & 7) != 0) || ((piVar7->m_comp_flags & 7) != 0)) {
                image_utils::print_ssim(other,piVar7);
              }
              vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&grayscale_b.m_pixel_buf);
              vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&grayscale_a.m_pixel_buf);
            }
            vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&b.m_pixel_buf);
            vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&a.m_pixel_buf);
            uVar8 = (ulong)(level_00 + 1);
          }
        }
        if (pCSVStatsFile != (char *)0x0) {
          a.m_width = 0;
          a.m_height = 0;
          a.m_pitch = 0;
          a.m_total = 0;
          a.m_pixel_buf.m_size = 0;
          a.m_pixel_buf.m_capacity = 0;
          a.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
          a.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
          b.m_width = 0;
          b.m_height = 0;
          b.m_pitch = 0;
          b.m_total = 0;
          b.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
          b.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
          b.m_pixel_buf.m_size = 0;
          b.m_pixel_buf.m_capacity = 0;
          b.m_comp_flags = uVar13;
          a.m_comp_flags = uVar13;
          piVar7 = mipmapped_texture::get_level_image(this->m_pInput_tex,0,0,&a,3);
          other_00 = mipmapped_texture::get_level_image(&this->m_output_tex,0,0,&b,3);
          if (other_00 != (image_u8 *)0x0 && piVar7 != (image_u8 *)0x0) {
            grayscale_a.m_width = 0;
            grayscale_a.m_height = 0;
            grayscale_a.m_pitch = 0;
            grayscale_a.m_total = 0;
            grayscale_a.m_pixel_buf.m_size = 0;
            grayscale_a.m_pixel_buf.m_capacity = 0;
            grayscale_a.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
            grayscale_a.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
            grayscale_b.m_width = 0;
            grayscale_b.m_height = 0;
            grayscale_b.m_pitch = 0;
            grayscale_b.m_total = 0;
            grayscale_b.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
            grayscale_b.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
            grayscale_b.m_pixel_buf.m_size = 0;
            grayscale_b.m_pixel_buf.m_capacity = 0;
            grayscale_a.m_comp_flags = uVar13;
            grayscale_b.m_comp_flags = uVar13;
            if (grayscale_sampling) {
              image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&grayscale_a,piVar7);
              piVar7 = &grayscale_a;
              image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale(piVar7);
              image<crnlib::color_quad<unsigned_char,_int>_>::operator=(&grayscale_b,other_00);
              image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale(&grayscale_b);
              other_00 = &grayscale_b;
            }
            rgb_error.mMeanSquared = 0.0;
            rgb_error.mRootMeanSquared = 0.0;
            rgb_error.mMax = 0;
            rgb_error._4_4_ = 0;
            rgb_error.mMean = 0.0;
            rgb_error.mPeakSNR = 0.0;
            luma_error.mMeanSquared = 0.0;
            luma_error.mRootMeanSquared = 0.0;
            luma_error.mMax = 0;
            luma_error._4_4_ = 0;
            luma_error.mMean = 0.0;
            luma_error.mPeakSNR = 0.0;
            bVar4 = image_utils::error_metrics::compute(&rgb_error,piVar7,other_00,0,3,false);
            if ((bVar4) &&
               (bVar4 = image_utils::error_metrics::compute(&luma_error,piVar7,other_00,0,0,true),
               bVar4)) {
              bVar4 = file_utils::does_file_exist(pCSVStatsFile);
              __s = fopen64(pCSVStatsFile,"a");
              if (__s == (FILE *)0x0) {
                console::warning("Unable to append to CSV stats file: %s\n",pCSVStatsFile);
              }
              else {
                if (!bVar4) {
                  fwrite("name,width,height,miplevels,rgb_rms,luma_rms,effective_output_size,effective_bitrate\n"
                         ,0x55,1,__s);
                }
                filename.m_buf_size = 0;
                filename.m_len = 0;
                filename.m_pStr = (char *)0x0;
                pcVar6 = (this->m_src_filename).m_pStr;
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = "";
                }
                file_utils::split_path
                          (pcVar6,(dynamic_string *)0x0,(dynamic_string *)0x0,&filename,
                           (dynamic_string *)0x0);
                uVar8 = this->m_output_comp_file_size;
                if (uVar8 == 0) {
                  uVar8 = this->m_output_file_size;
                }
                pcVar6 = "";
                if (filename.m_pStr != (char *)0x0) {
                  pcVar6 = filename.m_pStr;
                }
                if ((this->m_output_tex).m_faces.m_size == 0) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = (ulong)((this->m_output_tex).m_faces.m_p)->m_size;
                }
                fprintf(__s,"%s,%u,%u,%u,%f,%f,%u,%f\n",SUB84(rgb_error.mRootMeanSquared,0),
                        luma_error.mRootMeanSquared,
                        (double)(((float)uVar8 * 8.0) / (float)this->m_total_output_pixels),pcVar6,
                        (ulong)other_00->m_width,(ulong)other_00->m_height,uVar10,(int)uVar8);
                fclose(__s);
                dynamic_string::~dynamic_string(&filename);
              }
            }
            vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&grayscale_b.m_pixel_buf);
            vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&grayscale_a.m_pixel_buf);
          }
          vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&b.m_pixel_buf);
          vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&a.m_pixel_buf);
        }
      }
      else {
        console::warning(
                        "Unable to compute image statistics - input/output texture dimensions are different."
                        );
      }
    }
  }
  return pmVar2 != (mipmapped_texture *)0x0;
}

Assistant:

bool convert_stats::print(bool psnr_metrics, bool mip_stats, bool grayscale_sampling, const char* pCSVStatsFile) const
        {
            if (!m_pInput_tex)
            {
                return false;
            }

            console::info("Input texture: %ux%u, Levels: %u, Faces: %u, Format: %s",
                m_pInput_tex->get_width(),
                m_pInput_tex->get_height(),
                m_pInput_tex->get_num_levels(),
                m_pInput_tex->get_num_faces(),
                pixel_format_helpers::get_pixel_format_string(m_pInput_tex->get_format()));

            // Just casting the uint64's filesizes to uint32 here to work around gcc issues - it's not even possible to have files that large anyway.
            console::info("Input pixels: %u, Input file size: %u, Input bits/pixel: %1.3f",
                m_total_input_pixels, (uint32)m_input_file_size, (m_input_file_size * 8.0f) / m_total_input_pixels);

            console::info("Output texture: %ux%u, Levels: %u, Faces: %u, Format: %s",
                m_output_tex.get_width(),
                m_output_tex.get_height(),
                m_output_tex.get_num_levels(),
                m_output_tex.get_num_faces(),
                pixel_format_helpers::get_pixel_format_string(m_output_tex.get_format()));

            console::info("Output pixels: %u, Output file size: %u, Output bits/pixel: %1.3f",
                m_total_output_pixels, (uint32)m_output_file_size, (m_output_file_size * 8.0f) / m_total_output_pixels);

            if (m_output_comp_file_size)
            {
                console::info("LZMA compressed output file size: %u bytes, %1.3f bits/pixel",
                    (uint32)m_output_comp_file_size, (m_output_comp_file_size * 8.0f) / m_total_output_pixels);
            }
            if (psnr_metrics)
            {
                if ((m_pInput_tex->get_width() != m_output_tex.get_width()) || (m_pInput_tex->get_height() != m_output_tex.get_height()) || (m_pInput_tex->get_num_faces() != m_output_tex.get_num_faces()))
                {
                    console::warning("Unable to compute image statistics - input/output texture dimensions are different.");
                }
                else
                {
                    uint num_faces = math::minimum(m_pInput_tex->get_num_faces(), m_output_tex.get_num_faces());
                    uint num_levels = math::minimum(m_pInput_tex->get_num_levels(), m_output_tex.get_num_levels());

                    if (!mip_stats)
                    {
                        num_levels = 1;
                    }

                    for (uint face = 0; face < num_faces; face++)
                    {
                        for (uint level = 0; level < num_levels; level++)
                        {
                            image_u8 a, b;
                            image_u8* pA = m_pInput_tex->get_level_image(face, level, a);
                            image_u8* pB = m_output_tex.get_level_image(face, level, b);

                            if (pA && pB)
                            {
                                image_u8 grayscale_a, grayscale_b;
                                if (grayscale_sampling)
                                {
                                    grayscale_a = *pA;
                                    grayscale_a.convert_to_grayscale();
                                    pA = &grayscale_a;

                                    grayscale_b = *pB;
                                    grayscale_b.convert_to_grayscale();
                                    pB = &grayscale_b;
                                }

                                console::info("Face %u Mipmap level %u statistics:", face, level);
                                image_utils::print_image_metrics(*pA, *pB);

                                if ((pA->has_rgb()) || (pB->has_rgb()))
                                {
                                    image_utils::print_ssim(*pA, *pB);
                                }
                            }
                        }
                    }

                    if (pCSVStatsFile)
                    {
                        // FIXME: This is kind of a hack, and should be combined with the code above.
                        image_u8 a, b;
                        image_u8* pA = m_pInput_tex->get_level_image(0, 0, a);
                        image_u8* pB = m_output_tex.get_level_image(0, 0, b);
                        if (pA && pB)
                        {
                            image_u8 grayscale_a, grayscale_b;
                            if (grayscale_sampling)
                            {
                                grayscale_a = *pA;
                                grayscale_a.convert_to_grayscale();
                                pA = &grayscale_a;

                                grayscale_b = *pB;
                                grayscale_b.convert_to_grayscale();
                                pB = &grayscale_b;
                            }

                            image_utils::error_metrics rgb_error;
                            image_utils::error_metrics luma_error;
                            if (rgb_error.compute(*pA, *pB, 0, 3, false) && luma_error.compute(*pA, *pB, 0, 0, true))
                            {
                                bool bCSVStatsFileExists = file_utils::does_file_exist(pCSVStatsFile);
                                FILE* pFile;
                                crn_fopen(&pFile, pCSVStatsFile, "a");
                                if (!pFile)
                                {
                                    console::warning("Unable to append to CSV stats file: %s\n", pCSVStatsFile);
                                }
                                else
                                {
                                    if (!bCSVStatsFileExists)
                                    {
                                        fprintf(pFile, "name,width,height,miplevels,rgb_rms,luma_rms,effective_output_size,effective_bitrate\n");
                                    }
                                    dynamic_string filename;
                                    file_utils::split_path(m_src_filename.get_ptr(), nullptr, nullptr, &filename, nullptr);

                                    uint64 effective_output_size = m_output_comp_file_size ? m_output_comp_file_size : m_output_file_size;
                                    float bitrate = (effective_output_size * 8.0f) / m_total_output_pixels;
                                    fprintf(pFile, "%s,%u,%u,%u,%f,%f,%u,%f\n",
                                        filename.get_ptr(),
                                        pB->get_width(), pB->get_height(), m_output_tex.get_num_levels(),
                                        rgb_error.mRootMeanSquared, luma_error.mRootMeanSquared,
                                        (uint32)effective_output_size, bitrate);
                                    fclose(pFile);
                                }
                            }
                        }
                    }
                }
            }

            return true;
        }